

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<ParamsStream<AutoFile&,TransactionSerParams>,COutPoint,CScript,unsigned_int>
               (ParamsStream<AutoFile_&,_TransactionSerParams> *s,COutPoint *args,CScript *args_1,
               uint *args_2)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  COutPoint::
  SerializationOps<ParamsStream<AutoFile&,TransactionSerParams>,COutPoint_const,ActionSerialize>
            (args,s);
  Serialize<ParamsStream<AutoFile&,TransactionSerParams>,28u,unsigned_char>
            (s,&args_1->super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ser_writedata32<ParamsStream<AutoFile&,TransactionSerParams>>(s,*args_2);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}